

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O3

void __thiscall
edk2_vss_t::vss_variable_t::vss_variable_t
          (vss_variable_t *this,kstream *p__io,vss_store_body_t *p__parent,edk2_vss_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__vss_variable_t_002b1b40;
  (this->m_timestamp)._M_dataplus._M_p = (pointer)&(this->m_timestamp).field_2;
  (this->m_timestamp)._M_string_length = 0;
  (this->m_timestamp).field_2._M_local_buf[0] = '\0';
  (this->m_vendor_guid)._M_dataplus._M_p = (pointer)&(this->m_vendor_guid).field_2;
  (this->m_vendor_guid)._M_string_length = 0;
  (this->m_vendor_guid).field_2._M_local_buf[0] = '\0';
  (this->m_name_auth)._M_dataplus._M_p = (pointer)&(this->m_name_auth).field_2;
  (this->m_name_auth)._M_string_length = 0;
  (this->m_name_auth).field_2._M_local_buf[0] = '\0';
  (this->m_data_auth)._M_dataplus._M_p = (pointer)&(this->m_data_auth).field_2;
  (this->m_data_auth)._M_string_length = 0;
  (this->m_data_auth).field_2._M_local_buf[0] = '\0';
  (this->m_intel_legacy_data)._M_dataplus._M_p = (pointer)&(this->m_intel_legacy_data).field_2;
  (this->m_intel_legacy_data)._M_string_length = 0;
  (this->m_intel_legacy_data).field_2._M_local_buf[0] = '\0';
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = p__root;
  (this->m_attributes)._M_t.
  super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
  .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl =
       (vss_variable_attributes_t *)0x0;
  this->f_is_auth = false;
  this->f_len_standard_header = false;
  this->f_is_intel_legacy = false;
  this->f_len_auth_header = false;
  this->f_len_apple_header = false;
  this->f_len_intel_legacy_header = false;
  this->f_is_valid = false;
  _read(this);
  return;
}

Assistant:

edk2_vss_t::vss_variable_t::vss_variable_t(kaitai::kstream* p__io, edk2_vss_t::vss_store_body_t* p__parent, edk2_vss_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_attributes = nullptr;
    f_is_auth = false;
    f_len_standard_header = false;
    f_is_intel_legacy = false;
    f_len_auth_header = false;
    f_len_apple_header = false;
    f_len_intel_legacy_header = false;
    f_is_valid = false;
    _read();
}